

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

ssize_t MAFSA_automaton_find(MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  uint uVar6;
  
  puVar1 = ma->ptr_nodes;
  bVar2 = true;
  uVar6 = 0;
  puVar4 = puVar1;
  while( true ) {
    if (sz_l <= uVar6) {
      if (bVar2) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)(*puVar4 >> 0x1f);
      }
      return uVar5;
    }
    uVar3 = MAFSA_delta(ma->ptr_links,*puVar4,l[uVar6]);
    if (uVar3 == 0) break;
    uVar6 = uVar6 + 1;
    puVar4 = puVar1 + uVar3;
    bVar2 = false;
  }
  return 0;
}

Assistant:

extern ssize_t MAFSA_automaton_find(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l)
{
    uint32_t i = 0;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 0;

    while (i < sz_l)
    {
        MAFSA_letter label = l[i++];

        where = MAFSA_delta(ma->ptr_links, current, label);

        if (where)
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i < sz_l) return 0;
    if (!where) return 0;
    if (!node_is_final(current)) return 0;

    return 1;
}